

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImLineClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *p)

{
  ImVec2 IVar1;
  float fVar2;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  
  IVar1 = *a;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = IVar1.x;
  auVar4._4_4_ = IVar1.y;
  auVar7 = vmovshdup_avx(auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = b->x;
  auVar6._4_4_ = b->y;
  auVar6 = vsubps_avx(auVar6,auVar4);
  auVar4 = vmovshdup_avx(auVar6);
  fVar9 = auVar4._0_4_;
  fVar5 = auVar6._0_4_;
  fVar2 = (p->x - IVar1.x) * fVar5 + (p->y - auVar7._0_4_) * fVar9;
  if (fVar2 < 0.0) {
    return *a;
  }
  fVar9 = fVar5 * fVar5 + fVar9 * fVar9;
  if (fVar9 < fVar2) {
    return *b;
  }
  auVar7._0_4_ = fVar5 * fVar2;
  auVar7._4_4_ = auVar6._4_4_ * fVar2;
  auVar7._8_4_ = auVar6._8_4_ * fVar2;
  auVar7._12_4_ = auVar6._12_4_ * fVar2;
  auVar8._4_4_ = fVar9;
  auVar8._0_4_ = fVar9;
  auVar8._8_4_ = fVar9;
  auVar8._12_4_ = fVar9;
  auVar7 = vdivps_avx(auVar7,auVar8);
  IVar3.x = IVar1.x + auVar7._0_4_;
  IVar3.y = IVar1.y + auVar7._4_4_;
  return IVar3;
}

Assistant:

ImVec2 ImLineClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& p)
{
    ImVec2 ap = p - a;
    ImVec2 ab_dir = b - a;
    float dot = ap.x * ab_dir.x + ap.y * ab_dir.y;
    if (dot < 0.0f)
        return a;
    float ab_len_sqr = ab_dir.x * ab_dir.x + ab_dir.y * ab_dir.y;
    if (dot > ab_len_sqr)
        return b;
    return a + ab_dir * dot / ab_len_sqr;
}